

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph ccg2;
  cmComputeComponentGraph ccg1;
  allocator<char> local_1e9;
  string local_1e8;
  cmComputeComponentGraph local_1c8;
  cmComputeComponentGraph local_f0;
  
  CollectTargets(this);
  CollectDepends(this);
  if (this->DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"initial",(allocator<char> *)&local_1c8);
    DisplayGraph(this,&this->InitialGraph,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  cmComputeComponentGraph::cmComputeComponentGraph(&local_f0,&this->InitialGraph);
  cmComputeComponentGraph::Compute(&local_f0);
  bVar1 = CheckComponents(this,&local_f0);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_00383a8d;
  }
  CollectSideEffects(this);
  ComputeIntermediateGraph(this);
  if (this->DebugMode == true) {
    DisplaySideEffects(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"intermediate",(allocator<char> *)&local_1e8);
    DisplayGraph(this,&this->IntermediateGraph,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  cmComputeComponentGraph::cmComputeComponentGraph(&local_1c8,&this->IntermediateGraph);
  cmComputeComponentGraph::Compute(&local_1c8);
  if (this->DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"intermediate",&local_1e9);
    DisplayComponents(this,&local_1c8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  bVar1 = CheckComponents(this,&local_1c8);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,&local_1c8);
    if (!bVar1) goto LAB_00383a81;
    bVar1 = true;
    if (this->DebugMode == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"final",&local_1e9);
      DisplayGraph(this,&this->FinalGraph,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
  }
  else {
LAB_00383a81:
    bVar1 = false;
  }
  cmComputeComponentGraph::~cmComputeComponentGraph(&local_1c8);
LAB_00383a8d:
  cmComputeComponentGraph::~cmComputeComponentGraph(&local_f0);
  return bVar1;
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if (this->DebugMode) {
    this->DisplayGraph(this->InitialGraph, "initial");
  }
  cmComputeComponentGraph ccg1(this->InitialGraph);
  ccg1.Compute();
  if (!this->CheckComponents(ccg1)) {
    return false;
  }

  // Compute the intermediate graph.
  this->CollectSideEffects();
  this->ComputeIntermediateGraph();
  if (this->DebugMode) {
    this->DisplaySideEffects();
    this->DisplayGraph(this->IntermediateGraph, "intermediate");
  }

  // Identify components.
  cmComputeComponentGraph ccg2(this->IntermediateGraph);
  ccg2.Compute();
  if (this->DebugMode) {
    this->DisplayComponents(ccg2, "intermediate");
  }
  if (!this->CheckComponents(ccg2)) {
    return false;
  }

  // Compute the final dependency graph.
  if (!this->ComputeFinalDepends(ccg2)) {
    return false;
  }
  if (this->DebugMode) {
    this->DisplayGraph(this->FinalGraph, "final");
  }

  return true;
}